

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::UniformCase::compareUniformValues
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  const_reference local_40;
  VarValue *unifValue;
  BasicUniform *uniform;
  int unifNdx;
  bool success;
  TestLog *log;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  *values_local;
  UniformCase *this_local;
  
  log = (TestLog *)basicUniforms;
  basicUniforms_local =
       (vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
        *)values;
  values_local = (vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                  *)this;
  _unifNdx = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  uniform._7_1_ = 1;
  for (uniform._0_4_ = 0; iVar1 = (int)uniform,
      sVar3 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              ::size((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                      *)log), iVar1 < (int)sVar3; uniform._0_4_ = (int)uniform + 1) {
    unifValue = (VarValue *)
                std::
                vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                ::operator[]((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                              *)log,(long)(int)uniform);
    local_40 = std::
               vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
               ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                             *)basicUniforms_local,(long)(int)uniform);
    tcu::TestLog::operator<<(&local_1c0,_unifNdx,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [21])"// Checking uniform ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unifValue);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    if ((local_40->type != TYPE_INVALID) &&
       (bVar2 = apiVarValueEquals(local_40,(VarValue *)((long)&unifValue->val + 0x24)), !bVar2)) {
      tcu::TestLog::operator<<(&local_350,_unifNdx,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_350,
                          (char (*) [61])
                          "// FAILURE: value obtained with glGetUniform*() for uniform ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)unifValue);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [42])" differs from value set with glUniform*()");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      uniform._7_1_ = 0;
    }
  }
  return (bool)(uniform._7_1_ & 1);
}

Assistant:

bool UniformCase::compareUniformValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

		if (!apiVarValueEquals(unifValue, uniform.finalValue))
		{
			log << TestLog::Message << "// FAILURE: value obtained with glGetUniform*() for uniform " << uniform.name << " differs from value set with glUniform*()" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}